

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlChar * xmlNodeListGetString(xmlDocPtr doc,xmlNode *list,int inLine)

{
  xmlChar *pxVar1;
  xmlBufPtr buf;
  int escMode;
  
  if (list == (xmlNode *)0x0) {
    return (xmlChar *)0x0;
  }
  if (inLine == 0) {
    if ((list->parent == (_xmlNode *)0x0) || (list->parent->type != XML_ATTRIBUTE_NODE)) {
      escMode = 1;
    }
    else {
      escMode = 2;
    }
    pxVar1 = xmlNodeListGetStringInternal(doc,list,escMode);
    return pxVar1;
  }
  if ((list->type - XML_TEXT_NODE < 2) && (list->next == (_xmlNode *)0x0)) {
    pxVar1 = list->content;
    if (pxVar1 == (xmlChar *)0x0) {
      pxVar1 = "";
    }
    pxVar1 = xmlStrdup(pxVar1);
    return pxVar1;
  }
  buf = xmlBufCreate(0x32);
  if (buf == (xmlBufPtr)0x0) {
    pxVar1 = (xmlChar *)0x0;
  }
  else {
    for (; list != (xmlNode *)0x0; list = list->next) {
      if (list->type - XML_TEXT_NODE < 2) {
        if (list->content != (xmlChar *)0x0) {
          xmlBufCat(buf,list->content);
        }
      }
      else if (list->type == XML_ENTITY_REF_NODE) {
        xmlBufGetNodeContent(buf,list);
      }
    }
    pxVar1 = xmlBufDetach(buf);
    xmlBufFree(buf);
  }
  return pxVar1;
}

Assistant:

xmlChar *
xmlNodeListGetString(xmlDocPtr doc, const xmlNode *list, int inLine)
{
    int escMode;

    /* backward compatibility */
    if (list == NULL)
        return(NULL);

    if (inLine) {
        escMode = 0;
    } else {
        if ((list->parent != NULL) &&
            (list->parent->type == XML_ATTRIBUTE_NODE))
            escMode = 2;
        else
            escMode = 1;
    }

    return(xmlNodeListGetStringInternal(doc, list, escMode));
}